

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O0

void sha512_sw_round(uint round_index,uint64_t *schedule,uint64_t *a,uint64_t *b,uint64_t *c,
                    uint64_t *d,uint64_t *e,uint64_t *f,uint64_t *g,uint64_t *h)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t uVar4;
  uint64_t t2;
  uint64_t t1;
  uint64_t *d_local;
  uint64_t *c_local;
  uint64_t *b_local;
  uint64_t *a_local;
  uint64_t *schedule_local;
  uint round_index_local;
  
  uVar4 = *h;
  uVar1 = Sigma_1(*e);
  uVar2 = Ch(*e,*f,*g);
  lVar3 = uVar4 + uVar1 + uVar2 + sha512_round_constants[round_index] + schedule[round_index];
  uVar4 = Sigma_0(*a);
  uVar1 = Maj(*a,*b,*c);
  *d = lVar3 + *d;
  *h = lVar3 + uVar4 + uVar1;
  return;
}

Assistant:

static inline void sha512_sw_round(
    unsigned round_index, const uint64_t *schedule,
    uint64_t *a, uint64_t *b, uint64_t *c, uint64_t *d,
    uint64_t *e, uint64_t *f, uint64_t *g, uint64_t *h)
{
    uint64_t t1 = *h + Sigma_1(*e) + Ch(*e,*f,*g) +
        sha512_round_constants[round_index] + schedule[round_index];

    uint64_t t2 = Sigma_0(*a) + Maj(*a,*b,*c);

    *d += t1;
    *h = t1 + t2;
}